

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Block::WriteFile(Block *this)

{
  ostream *poVar1;
  ofstream out;
  byte abStack_1f0 [480];
  
  std::ofstream::ofstream((string *)&out);
  std::ofstream::open((string *)&out,(_Ios_Openmode)this);
  if ((abStack_1f0[*(long *)(_out + -0x18)] & 1) == 0) {
    std::ostream::seekp(&out,(long)this->FileOff << 0xd,0);
    std::ostream::write((char *)&out,(long)this->data);
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)this);
  poVar1 = std::operator<<(poVar1,": No such a file!");
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  exit(1);
}

Assistant:

void Block::WriteFile(void) {
	ofstream out;
	out.open(this->FileName, ios::out | ios::in | ios::binary);
    if (out.bad()) {
        cout << this->FileName << ": No such a file!" << endl;
        system("pause");
        exit(1);
    }
	out.seekp(this->FileOff * BLOCK_SIZE);
	//cout << out.tellp() << endl;
	out.write(reinterpret_cast<char*>(this->data), BLOCK_SIZE);
	out.close();
}